

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::v_formatter<spdlog::details::scoped_padder>::format
          (v_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  long in_RSI;
  scoped_padder *in_RDI;
  scoped_padder p;
  memory_buf_t *in_stack_ffffffffffffff98;
  memory_buf_t *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  scoped_padder *in_stack_ffffffffffffffb0;
  
  ::fmt::v6::basic_string_view<char>::size((basic_string_view<char> *)(in_RSI + 0x50));
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (padding_info *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  fmt_helper::append_string_view(*(string_view_t *)(in_RSI + 0x50),in_stack_ffffffffffffffa0);
  scoped_padder::~scoped_padder(in_RDI);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        ScopedPadder p(msg.payload.size(), padinfo_, dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }